

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O1

void cm_zlib_inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte *pbVar2;
  Bytef *pBVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  internal_state *piVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  Bytef *pBVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  Bytef *pBVar24;
  ushort uVar25;
  uint uVar26;
  Bytef *pBVar27;
  uint uVar28;
  Bytef *pBVar29;
  int local_40;
  
  piVar8 = strm->state;
  pBVar27 = strm->next_in + ((ulong)(strm->avail_in - 5) - 1);
  pBVar18 = strm->next_in + -1;
  pBVar24 = strm->next_out + -1;
  local_40 = (int)pBVar24 - (start - strm->avail_out);
  pBVar29 = strm->next_out + ((ulong)(strm->avail_out - 0x101) - 1);
  iVar16 = piVar8[0xd].dummy;
  uVar6 = piVar8[0xe].dummy;
  uVar7 = piVar8[0xf].dummy;
  lVar19 = *(long *)(piVar8 + 0x10);
  uVar22 = *(ulong *)(piVar8 + 0x12);
  uVar13 = piVar8[0x14].dummy;
  iVar11 = piVar8[0x1c].dummy;
  iVar12 = piVar8[0x1d].dummy;
  lVar9 = *(long *)(piVar8 + 0x18);
  lVar10 = *(long *)(piVar8 + 0x1a);
LAB_004560e7:
  if (uVar13 < 0xf) {
    pbVar1 = pBVar18 + 1;
    pbVar2 = pBVar18 + 2;
    pBVar18 = pBVar18 + 2;
    uVar22 = ((ulong)*pbVar2 << ((byte)uVar13 + 8 & 0x3f)) +
             ((ulong)*pbVar1 << ((byte)uVar13 & 0x3f)) + uVar22;
    uVar13 = uVar13 | 0x10;
  }
  uVar21 = (ulong)((uint)uVar22 & ~(-1 << ((byte)iVar11 & 0x1f)));
  while( true ) {
    bVar4 = *(byte *)(lVar9 + 1 + uVar21 * 4);
    uVar22 = uVar22 >> (bVar4 & 0x3f);
    bVar5 = *(byte *)(lVar9 + uVar21 * 4);
    uVar25 = *(ushort *)(lVar9 + 2 + uVar21 * 4);
    uVar13 = uVar13 - bVar4;
    if (bVar5 == 0) break;
    if ((bVar5 & 0x10) != 0) {
      uVar28 = (uint)uVar25;
      uVar15 = bVar5 & 0xf;
      if ((bVar5 & 0xf) != 0) {
        if (uVar13 < uVar15) {
          pbVar1 = pBVar18 + 1;
          pBVar18 = pBVar18 + 1;
          uVar22 = uVar22 + ((ulong)*pbVar1 << ((byte)uVar13 & 0x3f));
          uVar13 = uVar13 + 8;
        }
        uVar28 = (uint)uVar25 + (~(-1 << (sbyte)uVar15) & (uint)uVar22);
        uVar22 = uVar22 >> (sbyte)uVar15;
        uVar13 = uVar13 - uVar15;
      }
      if (uVar13 < 0xf) {
        pbVar1 = pBVar18 + 1;
        pbVar2 = pBVar18 + 2;
        pBVar18 = pBVar18 + 2;
        uVar22 = ((ulong)*pbVar2 << ((byte)uVar13 + 8 & 0x3f)) +
                 ((ulong)*pbVar1 << ((byte)uVar13 & 0x3f)) + uVar22;
        uVar13 = uVar13 | 0x10;
      }
      uVar21 = (ulong)((uint)uVar22 & ~(-1 << ((byte)iVar12 & 0x1f)));
      bVar5 = *(byte *)(lVar10 + uVar21 * 4);
      bVar4 = *(byte *)(lVar10 + 1 + uVar21 * 4);
      uVar25 = *(ushort *)(lVar10 + 2 + uVar21 * 4);
      uVar22 = uVar22 >> (bVar4 & 0x3f);
      uVar13 = uVar13 - bVar4;
      goto LAB_004561eb;
    }
    if ((bVar5 & 0x40) != 0) {
      iVar16 = 0xb;
      if ((bVar5 & 0x20) != 0) goto LAB_004564c1;
      pcVar14 = "invalid literal/length code";
      goto LAB_004564b8;
    }
    uVar21 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar22) + (ulong)uVar25;
  }
  pBVar24[1] = (Bytef)uVar25;
  pBVar24 = pBVar24 + 1;
  goto LAB_00456472;
LAB_004561eb:
  if ((bVar5 & 0x10) != 0) goto LAB_00456229;
  if ((bVar5 & 0x40) != 0) {
    pcVar14 = "invalid distance code";
    goto LAB_004564b8;
  }
  lVar23 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar22) + (ulong)uVar25;
  bVar4 = *(byte *)(lVar10 + 1 + lVar23 * 4);
  uVar22 = uVar22 >> (bVar4 & 0x3f);
  bVar5 = *(byte *)(lVar10 + lVar23 * 4);
  uVar25 = *(ushort *)(lVar10 + 2 + lVar23 * 4);
  uVar13 = uVar13 - bVar4;
  goto LAB_004561eb;
LAB_00456229:
  uVar15 = bVar5 & 0xf;
  if (uVar13 < uVar15) {
    uVar22 = ((ulong)pBVar18[1] << ((byte)uVar13 & 0x3f)) + uVar22;
    uVar20 = uVar13 + 8;
    if (uVar20 < uVar15) {
      pbVar1 = pBVar18 + 2;
      pBVar18 = pBVar18 + 2;
      uVar22 = uVar22 + ((ulong)*pbVar1 << ((byte)uVar20 & 0x3f));
      uVar13 = uVar13 + 0x10;
    }
    else {
      pBVar18 = pBVar18 + 1;
      uVar13 = uVar20;
    }
  }
  uVar20 = (~(-1 << (sbyte)uVar15) & (uint)uVar22) + (uint)uVar25;
  uVar22 = uVar22 >> (sbyte)uVar15;
  uVar13 = uVar13 - uVar15;
  uVar15 = (int)pBVar24 - local_40;
  uVar26 = uVar20 - uVar15;
  if (uVar20 < uVar15 || uVar26 == 0) {
    uVar21 = (ulong)uVar20;
    lVar23 = 0;
    uVar15 = uVar28;
    do {
      lVar17 = lVar23;
      pBVar24[lVar17 + 1] = pBVar24[lVar17 + (1 - uVar21)];
      pBVar24[lVar17 + 2] = pBVar24[lVar17 + (2 - uVar21)];
      pBVar24[lVar17 + 3] = pBVar24[lVar17 + (3 - uVar21)];
      uVar15 = uVar15 - 3;
      lVar23 = lVar17 + 3;
    } while (2 < uVar15);
    if ((uint)lVar23 == uVar28) {
      pBVar24 = pBVar24 + lVar23;
    }
    else {
      pBVar24[lVar17 + 4] = pBVar24[-uVar21 + 1 + lVar23];
      if ((uint)lVar23 - uVar28 == -2) {
        pBVar3 = pBVar24 + -uVar21 + 2 + lVar23;
        pBVar24 = pBVar24 + lVar17 + 5;
        *pBVar24 = *pBVar3;
      }
      else {
        pBVar24 = pBVar24 + lVar17 + 4;
      }
    }
    goto LAB_00456472;
  }
  if (uVar6 < uVar26) {
    pcVar14 = "invalid distance too far back";
LAB_004564b8:
    strm->msg = pcVar14;
    iVar16 = 0x1b;
LAB_004564c1:
    piVar8->dummy = iVar16;
LAB_004564c4:
    lVar19 = (long)pBVar18 - (ulong)(uVar13 >> 3);
    strm->next_in = (Bytef *)(lVar19 + 1);
    strm->next_out = pBVar24 + 1;
    strm->avail_in = ((int)pBVar27 - (int)lVar19) + 5;
    strm->avail_out = ((int)pBVar29 - (int)pBVar24) + 0x101;
    *(ulong *)(piVar8 + 0x12) = (ulong)((uint)uVar22 & ~(-1 << (sbyte)(uVar13 & 7)));
    piVar8[0x14].dummy = uVar13 & 7;
    return;
  }
  if (uVar7 == 0) {
    uVar21 = (ulong)(iVar16 - uVar26);
    uVar15 = uVar28 - uVar26;
    if (uVar28 < uVar26 || uVar15 == 0) goto LAB_004563ff;
    lVar23 = 0;
    do {
      pBVar24[1] = *(Bytef *)(uVar21 + lVar19 + lVar23);
      pBVar24 = pBVar24 + 1;
      lVar23 = lVar23 + 1;
    } while (uVar26 != (uint)lVar23);
LAB_004563f2:
    lVar23 = (long)pBVar24 - (ulong)uVar20;
  }
  else {
    if (uVar7 < uVar26) {
      uVar21 = (ulong)((uVar7 + iVar16) - uVar26);
      uVar26 = uVar26 - uVar7;
      uVar15 = uVar28 - uVar26;
      if (uVar26 <= uVar28 && uVar15 != 0) {
        lVar23 = 0;
        do {
          pBVar24[lVar23 + 1] = *(Bytef *)(uVar21 + lVar19 + lVar23);
          lVar23 = lVar23 + 1;
        } while (uVar26 != (uint)lVar23);
        pBVar24 = pBVar24 + lVar23;
        lVar23 = lVar19 + -1;
        if (uVar7 < uVar15) {
          lVar23 = 0;
          do {
            pBVar24[1] = *(Bytef *)(lVar19 + lVar23);
            pBVar24 = pBVar24 + 1;
            lVar23 = lVar23 + 1;
          } while (uVar7 != (uint)lVar23);
          uVar15 = uVar15 - uVar7;
          goto LAB_004563f2;
        }
        goto joined_r0x00456408;
      }
    }
    else {
      uVar21 = (ulong)(uVar7 - uVar26);
      uVar15 = uVar28 - uVar26;
      if (uVar26 <= uVar28 && uVar15 != 0) {
        lVar23 = 0;
        do {
          pBVar24[1] = *(Bytef *)(uVar21 + lVar19 + lVar23);
          pBVar24 = pBVar24 + 1;
          lVar23 = lVar23 + 1;
        } while (uVar26 != (uint)lVar23);
        goto LAB_004563f2;
      }
    }
LAB_004563ff:
    lVar23 = uVar21 + lVar19 + -1;
    uVar15 = uVar28;
  }
joined_r0x00456408:
  for (; 2 < uVar15; uVar15 = uVar15 - 3) {
    pBVar24[1] = *(Bytef *)(lVar23 + 1);
    pBVar24[2] = *(Bytef *)(lVar23 + 2);
    pBVar24[3] = *(Bytef *)(lVar23 + 3);
    pBVar24 = pBVar24 + 3;
    lVar23 = lVar23 + 3;
  }
  if (uVar15 != 0) {
    pBVar24[1] = *(Bytef *)(lVar23 + 1);
    if (uVar15 == 2) {
      pBVar24[2] = *(Bytef *)(lVar23 + 2);
      pBVar24 = pBVar24 + 2;
    }
    else {
      pBVar24 = pBVar24 + 1;
    }
  }
LAB_00456472:
  if ((pBVar27 <= pBVar18) || (pBVar29 <= pBVar24)) goto LAB_004564c4;
  goto LAB_004560e7;
}

Assistant:

void inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned write;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code this;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    write = state->write;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
        }
        this = lcode[hold & lmask];
      dolen:
        op = (unsigned)(this.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(this.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, this.val >= 0x20 && this.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", this.val));
            PUP(out) = (unsigned char)(this.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(this.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
            }
            this = dcode[hold & dmask];
          dodist:
            op = (unsigned)(this.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(this.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(this.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        strm->msg = (char *)"invalid distance too far back";
                        state->mode = BAD;
                        break;
                    }
                    from = window - OFF;
                    if (write == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (write < op) {      /* wrap around window */
                        from += wsize + write - op;
                        op -= write;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (write < len) {  /* some from start of window */
                                op = write;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += write - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                this = dcode[this.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            this = lcode[this.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}